

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TZGNCore::findBestMatch
          (TZGNCore *this,UnicodeString *text,int32_t start,uint32_t types,UnicodeString *tzID,
          UTimeZoneFormatTimeType *timeType,UErrorCode *status)

{
  short sVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  UBool UVar5;
  int32_t iVar6;
  int iVar7;
  UTimeZoneNameType UVar8;
  int32_t iVar9;
  MatchInfoCollection *this_00;
  UMemory *this_01;
  int32_t i_1;
  uint index;
  int32_t i;
  int iVar10;
  UTimeZoneFormatTimeType local_e8;
  UnicodeString bestMatchTzID;
  UnicodeString mzID;
  
  *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  UnicodeString::setToBogus(tzID);
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  this_00 = findTimeZoneNames(this,text,start,types,status);
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  bestMatchTzID.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003edbf0;
  bestMatchTzID.fUnion.fStackFields.fLengthAndFlags = 2;
  if (this_00 == (MatchInfoCollection *)0x0) {
    local_e8 = UTZFMT_TIME_TYPE_UNKNOWN;
    iVar7 = 0;
  }
  else {
    mzID.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003edbf0;
    mzID.fUnion.fStackFields.fLengthAndFlags = 2;
    bVar3 = false;
    local_e8 = UTZFMT_TIME_TYPE_UNKNOWN;
    iVar9 = 0;
    for (iVar10 = 0; iVar6 = TimeZoneNames::MatchInfoCollection::size(this_00), iVar7 = iVar9,
        iVar10 < iVar6; iVar10 = iVar10 + 1) {
      iVar7 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(this_00,iVar10);
      if (iVar9 < iVar7) {
        UVar5 = TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt(this_00,iVar10,&bestMatchTzID);
        if ((UVar5 == '\0') &&
           (UVar5 = TimeZoneNames::MatchInfoCollection::getMetaZoneIDAt(this_00,iVar10,&mzID),
           UVar5 != '\0')) {
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                    (this->fTimeZoneNames,&mzID,this->fTargetRegion,&bestMatchTzID);
        }
        UVar8 = TimeZoneNames::MatchInfoCollection::getNameTypeAt(this_00,iVar10);
        if (U_ZERO_ERROR < *status) break;
        iVar9 = iVar7;
        if (UVar8 == UTZNM_LONG_STANDARD) {
LAB_00214fee:
          local_e8 = UTZFMT_TIME_TYPE_STANDARD;
          bVar3 = true;
        }
        else {
          if (UVar8 != UTZNM_SHORT_DAYLIGHT) {
            if (UVar8 == UTZNM_SHORT_STANDARD) goto LAB_00214fee;
            if (UVar8 != UTZNM_LONG_DAYLIGHT) {
              local_e8 = UTZFMT_TIME_TYPE_UNKNOWN;
              goto LAB_00215000;
            }
          }
          local_e8 = UTZFMT_TIME_TYPE_DAYLIGHT;
        }
      }
LAB_00215000:
    }
    (*this_00->_vptr_MatchInfoCollection[1])(this_00);
    bVar4 = false;
    iVar9 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar10 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar10 = (int)sVar1 >> 5;
      }
      if (bVar3 || iVar7 != iVar10 - start) {
        bVar4 = true;
      }
      else {
        UnicodeString::setTo(tzID,&bestMatchTzID);
        *timeType = local_e8;
        bVar4 = false;
        iVar9 = iVar7;
      }
    }
    UnicodeString::~UnicodeString(&mzID);
    if (!bVar4) goto LAB_0021514e;
  }
  this_01 = (UMemory *)findLocal(this,text,start,types,status);
  iVar9 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar9 = iVar7;
    if (this_01 != (UMemory *)0x0) {
      index = 0;
      while (plVar2 = *(long **)this_01, plVar2 != (long *)0x0) {
        if ((int)plVar2[1] <= (int)index) {
          (**(code **)(*plVar2 + 8))();
          break;
        }
        text = (UnicodeString *)(ulong)index;
        iVar9 = TimeZoneGenericNameMatchInfo::getMatchLength
                          ((TimeZoneGenericNameMatchInfo *)this_01,index);
        if (iVar7 <= iVar9) {
          iVar7 = TimeZoneGenericNameMatchInfo::getMatchLength
                            ((TimeZoneGenericNameMatchInfo *)this_01,index);
          text = (UnicodeString *)(ulong)index;
          TimeZoneGenericNameMatchInfo::getTimeZoneID
                    ((TimeZoneGenericNameMatchInfo *)this_01,index,&bestMatchTzID);
          local_e8 = UTZFMT_TIME_TYPE_UNKNOWN;
        }
        index = index + 1;
      }
      UMemory::operator_delete(this_01,text);
      iVar9 = iVar7;
    }
    if (0 < iVar9) {
      *timeType = local_e8;
      UnicodeString::setTo(tzID,&bestMatchTzID);
    }
  }
LAB_0021514e:
  UnicodeString::~UnicodeString(&bestMatchTzID);
  return iVar9;
}

Assistant:

int32_t
TZGNCore::findBestMatch(const UnicodeString& text, int32_t start, uint32_t types,
        UnicodeString& tzID, UTimeZoneFormatTimeType& timeType, UErrorCode& status) const {
    timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    tzID.setToBogus();

    if (U_FAILURE(status)) {
        return 0;
    }

    // Find matches in the TimeZoneNames first
    TimeZoneNames::MatchInfoCollection *tznamesMatches = findTimeZoneNames(text, start, types, status);
    if (U_FAILURE(status)) {
        return 0;
    }

    int32_t bestMatchLen = 0;
    UTimeZoneFormatTimeType bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
    UnicodeString bestMatchTzID;
    // UBool isLongStandard = FALSE;   // workaround - see the comments below
    UBool isStandard = FALSE;       // TODO: Temporary hack (on hack) for short standard name/location name conflict (found in zh_Hant), should be removed after CLDR 21m1 integration

    if (tznamesMatches != NULL) {
        UnicodeString mzID;
        for (int32_t i = 0; i < tznamesMatches->size(); i++) {
            int32_t len = tznamesMatches->getMatchLengthAt(i);
            if (len > bestMatchLen) {
                bestMatchLen = len;
                if (!tznamesMatches->getTimeZoneIDAt(i, bestMatchTzID)) {
                    // name for a meta zone
                    if (tznamesMatches->getMetaZoneIDAt(i, mzID)) {
                        fTimeZoneNames->getReferenceZoneID(mzID, fTargetRegion, bestMatchTzID);
                    }
                }
                UTimeZoneNameType nameType = tznamesMatches->getNameTypeAt(i);
                if (U_FAILURE(status)) {
                    break;
                }
                switch (nameType) {
                case UTZNM_LONG_STANDARD:
                    // isLongStandard = TRUE;
                case UTZNM_SHORT_STANDARD:  // this one is never used for generic, but just in case
                    isStandard = TRUE;      // TODO: Remove this later, see the comments above.
                    bestMatchTimeType = UTZFMT_TIME_TYPE_STANDARD;
                    break;
                case UTZNM_LONG_DAYLIGHT:
                case UTZNM_SHORT_DAYLIGHT: // this one is never used for generic, but just in case
                    bestMatchTimeType = UTZFMT_TIME_TYPE_DAYLIGHT;
                    break;
                default:
                    bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                }
            }
        }
        delete tznamesMatches;
        if (U_FAILURE(status)) {
            return 0;
        }

        if (bestMatchLen == (text.length() - start)) {
            // Full match

            //tzID.setTo(bestMatchTzID);
            //timeType = bestMatchTimeType;
            //return bestMatchLen;

            // TODO Some time zone uses a same name for the long standard name
            // and the location name. When the match is a long standard name,
            // then we need to check if the name is same with the location name.
            // This is probably a data error or a design bug.
/*
            if (!isLongStandard) {
                tzID.setTo(bestMatchTzID);
                timeType = bestMatchTimeType;
                return bestMatchLen;
            }
*/
            // TODO The deprecation of commonlyUsed flag introduced the name
            // conflict not only for long standard names, but short standard names too.
            // These short names (found in zh_Hant) should be gone once we clean
            // up CLDR time zone display name data. Once the short name conflict
            // problem (with location name) is resolved, we should change the condition
            // below back to the original one above. -Yoshito (2011-09-14)
            if (!isStandard) {
                tzID.setTo(bestMatchTzID);
                timeType = bestMatchTimeType;
                return bestMatchLen;
            }
        }
    }

    // Find matches in the local trie
    TimeZoneGenericNameMatchInfo *localMatches = findLocal(text, start, types, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    if (localMatches != NULL) {
        for (int32_t i = 0; i < localMatches->size(); i++) {
            int32_t len = localMatches->getMatchLength(i);

            // TODO See the above TODO. We use len >= bestMatchLen
            // because of the long standard/location name collision
            // problem. If it is also a location name, carrying
            // timeType = UTZFMT_TIME_TYPE_STANDARD will cause a
            // problem in SimpleDateFormat
            if (len >= bestMatchLen) {
                bestMatchLen = localMatches->getMatchLength(i);
                bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;   // because generic
                localMatches->getTimeZoneID(i, bestMatchTzID);
            }
        }
        delete localMatches;
    }

    if (bestMatchLen > 0) {
        timeType = bestMatchTimeType;
        tzID.setTo(bestMatchTzID);
    }
    return bestMatchLen;
}